

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O3

void duckdb::BaseModeFunction<duckdb::ModeStandard<double>>::
     Combine<duckdb::ModeState<double,duckdb::ModeStandard<double>>,duckdb::EntropyFunction<duckdb::ModeStandard<double>>>
               (ModeState<double,_duckdb::ModeStandard<double>_> *source,
               ModeState<double,_duckdb::ModeStandard<double>_> *target,AggregateInputData *param_3)

{
  _Hashtable<double,_std::pair<const_double,_duckdb::ModeAttr>,_std::allocator<std::pair<const_double,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *__ht;
  size_t sVar1;
  mapped_type *pmVar2;
  _Hashtable<double,std::pair<double_const,duckdb::ModeAttr>,std::allocator<std::pair<double_const,duckdb::ModeAttr>>,std::__detail::_Select1st,std::equal_to<double>,std::hash<double>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *this;
  _Hash_node_base *p_Var3;
  _Hash_node_base *p_Var4;
  __alloc_node_gen_t __alloc_node_gen;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_double,_duckdb::ModeAttr>,_false>_>_>
  local_28;
  
  __ht = &source->frequency_map->_M_h;
  if (__ht != (_Hashtable<double,_std::pair<const_double,_duckdb::ModeAttr>,_std::allocator<std::pair<const_double,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)0x0) {
    if (target->frequency_map == (Counts *)0x0) {
      this = (_Hashtable<double,std::pair<double_const,duckdb::ModeAttr>,std::allocator<std::pair<double_const,duckdb::ModeAttr>>,std::__detail::_Select1st,std::equal_to<double>,std::hash<double>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)operator_new(0x38);
      *(undefined8 *)this = 0;
      *(size_type *)(this + 8) = __ht->_M_bucket_count;
      *(undefined8 *)(this + 0x10) = 0;
      *(size_type *)(this + 0x18) = __ht->_M_element_count;
      sVar1 = (__ht->_M_rehash_policy)._M_next_resize;
      *(undefined8 *)(this + 0x20) = *(undefined8 *)&__ht->_M_rehash_policy;
      *(size_t *)(this + 0x28) = sVar1;
      *(undefined8 *)(this + 0x30) = 0;
      local_28._M_h = (__hashtable_alloc *)this;
      ::std::
      _Hashtable<double,std::pair<double_const,duckdb::ModeAttr>,std::allocator<std::pair<double_const,duckdb::ModeAttr>>,std::__detail::_Select1st,std::equal_to<double>,std::hash<double>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_assign<std::_Hashtable<double,std::pair<double_const,duckdb::ModeAttr>,std::allocator<std::pair<double_const,duckdb::ModeAttr>>,std::__detail::_Select1st,std::equal_to<double>,std::hash<double>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<double_const,duckdb::ModeAttr>,false>>>>
                (this,__ht,&local_28);
      target->frequency_map = (Counts *)this;
      target->count = source->count;
    }
    else {
      for (p_Var4 = (__ht->_M_before_begin)._M_nxt; p_Var4 != (_Hash_node_base *)0x0;
          p_Var4 = p_Var4->_M_nxt) {
        pmVar2 = ::std::__detail::
                 _Map_base<double,_std::pair<const_double,_duckdb::ModeAttr>,_std::allocator<std::pair<const_double,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<double,_std::pair<const_double,_duckdb::ModeAttr>,_std::allocator<std::pair<const_double,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)target->frequency_map,(key_type *)(p_Var4 + 1));
        pmVar2->count = (long)&(p_Var4[2]._M_nxt)->_M_nxt + pmVar2->count;
        p_Var3 = p_Var4[3]._M_nxt;
        if ((_Hash_node_base *)pmVar2->first_row < p_Var4[3]._M_nxt) {
          p_Var3 = (_Hash_node_base *)pmVar2->first_row;
        }
        pmVar2->first_row = (idx_t)p_Var3;
      }
      target->count = target->count + source->count;
    }
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.frequency_map) {
			return;
		}
		if (!target.frequency_map) {
			// Copy - don't destroy! Otherwise windowing will break.
			target.frequency_map = new typename STATE::Counts(*source.frequency_map);
			target.count = source.count;
			return;
		}
		for (auto &val : *source.frequency_map) {
			auto &i = (*target.frequency_map)[val.first];
			i.count += val.second.count;
			i.first_row = MinValue(i.first_row, val.second.first_row);
		}
		target.count += source.count;
	}